

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O3

void __thiscall
amrex::MLCellLinOp::correctionResidual
          (MLCellLinOp *this,int amrlev,int mglev,MultiFab *resid,MultiFab *x,MultiFab *b,
          BCMode bc_mode,MultiFab *crse_bcdata)

{
  int numcomp;
  
  numcomp = (*(this->super_MLLinOp)._vptr_MLLinOp[5])();
  if (bc_mode == Inhomogeneous) {
    if (crse_bcdata != (MultiFab *)0x0) {
      if (mglev != 0) {
        Assert_host("mglev == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLCellLinOp.cpp"
                    ,0x229,(char *)0x0);
      }
      if (amrlev < 1) {
        Assert_host("amrlev > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLCellLinOp.cpp"
                    ,0x22a,(char *)0x0);
      }
      updateCorBC(this,amrlev,crse_bcdata);
    }
    (*(this->super_MLLinOp)._vptr_MLLinOp[0xd])
              (this,(ulong)(uint)amrlev,(ulong)(uint)mglev,resid,x,1,1,
               (tuple<amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>)
               (this->m_bndry_cor).
               super_vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[amrlev]._M_t.
               super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>);
  }
  else {
    if (crse_bcdata != (MultiFab *)0x0) {
      Assert_host("crse_bcdata == nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLCellLinOp.cpp"
                  ,0x232,(char *)0x0);
    }
    (*(this->super_MLLinOp)._vptr_MLLinOp[0xd])
              (this,(ulong)(uint)amrlev,(ulong)(uint)mglev,resid,x,0,1,0);
  }
  MultiFab::Xpay(resid,-1.0,b,0,0,numcomp,0);
  return;
}

Assistant:

void
MLCellLinOp::correctionResidual (int amrlev, int mglev, MultiFab& resid, MultiFab& x, const MultiFab& b,
                                 BCMode bc_mode, const MultiFab* crse_bcdata)
{
    BL_PROFILE("MLCellLinOp::correctionResidual()");
    const int ncomp = getNComp();
    if (bc_mode == BCMode::Inhomogeneous)
    {
        if (crse_bcdata)
        {
            AMREX_ALWAYS_ASSERT(mglev == 0);
            AMREX_ALWAYS_ASSERT(amrlev > 0);
            updateCorBC(amrlev, *crse_bcdata);
        }
        apply(amrlev, mglev, resid, x, BCMode::Inhomogeneous, StateMode::Correction,
              m_bndry_cor[amrlev].get());
    }
    else
    {
        AMREX_ALWAYS_ASSERT(crse_bcdata == nullptr);
        apply(amrlev, mglev, resid, x, BCMode::Homogeneous, StateMode::Correction, nullptr);
    }

    MultiFab::Xpay(resid, Real(-1.0), b, 0, 0, ncomp, 0);
}